

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flt2vrml.c
# Opt level: O0

void convertFaceset(faceset *data,FILE *file)

{
  int iVar1;
  FILE *in_RSI;
  undefined8 *in_RDI;
  int color_per_vertex;
  float trans;
  float tmp [3];
  float b;
  float g;
  float r;
  int tcnt;
  int lcnt;
  int vcnt;
  int icnt;
  int n;
  int i;
  int dotex;
  int *in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffb0;
  uint uVar2;
  int iVar3;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  uint local_14;
  FILE *local_10;
  undefined8 *local_8;
  
  iVar3 = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_20 = array_count((void *)in_RDI[3]);
  local_24 = bsp_get_num_points((void *)CONCAT44(iVar3,in_stack_ffffffffffffffb0));
  local_28 = array_count((void *)local_8[4]);
  local_2c = array_count((void *)local_8[5]);
  uVar2 = in_stack_ffffffffffffffb0 & 0xffffff;
  if (-1 < *(short *)((long)local_8 + 0x3c)) {
    uVar2 = CONCAT13(local_8[8] != 0,(int3)in_stack_ffffffffffffffb0);
  }
  local_14 = uVar2 >> 0x18;
  if (local_24 != 0) {
    fprintf(local_10,"  Separator {\n");
    if (local_14 != 0) {
      fprintf(local_10,"  Texture2 {\n    filename \"%s\"\n  }\n",local_8[8]);
    }
    local_30 = (float)*(byte *)(local_8 + 7) / 255.0;
    local_34 = (float)((uint)*(byte *)((long)local_8 + 0x39) << 8) / 65280.0;
    local_38 = (float)((uint)*(byte *)((long)local_8 + 0x3a) << 0x10) / 1.671168e+07;
    if ((*(short *)((long)local_8 + 0x4c) == 1) || (*(short *)((long)local_8 + 0x4c) == 3)) {
      iVar1 = bsp_get_num_points((void *)CONCAT44(iVar3,uVar2));
      if (iVar1 < 2) {
        bsp_get_point((void *)*local_8,0,&local_44);
        local_30 = local_44;
        local_34 = local_40;
        local_38 = local_3c;
      }
      else {
        iVar3 = 1;
      }
    }
    if (iVar3 == 0) {
      fprintf(local_10,"  Material {\n    diffuseColor %g %g %g\n    ambientColor %g %g %g\n",
              (double)(*(float *)(local_8 + 0xe) * local_30),
              (double)(*(float *)((long)local_8 + 0x74) * local_34),
              (double)(*(float *)(local_8 + 0xf) * local_38),
              (double)(*(float *)((long)local_8 + 100) * local_30),
              (double)(*(float *)(local_8 + 0xd) * local_34),
              (double)(*(float *)((long)local_8 + 0x6c) * local_38));
    }
    else {
      fprintf(local_10,"  Material {\n    ambientColor %g %g %g\n    diffuseColor [\n",
              (double)*(float *)((long)local_8 + 100),(double)*(float *)(local_8 + 0xd),
              (double)*(float *)((long)local_8 + 0x6c));
      local_1c = bsp_get_num_points((void *)CONCAT44(iVar3,uVar2));
      for (local_18 = 0; local_18 < local_1c; local_18 = local_18 + 1) {
        bsp_get_point((void *)*local_8,local_18,&local_44);
        if (local_18 < local_1c + -1) {
          fprintf(local_10,"      %g %g %g,\n",(double)local_44,(double)local_40,(double)local_3c);
        }
        else {
          fprintf(local_10,"      %g %g %g\n",(double)local_44,(double)local_40,(double)local_3c);
        }
      }
      fprintf(local_10,"    ]\n");
    }
    local_48 = -*(float *)(local_8 + 0x13) *
               (1.0 - (float)*(ushort *)((long)local_8 + 0x4a) / 65535.0) + 1.0;
    if (0.003921569 <= local_48) {
      if (1.0 < local_48) {
        local_48 = 1.0;
      }
    }
    else {
      local_48 = 0.0;
    }
    fprintf(local_10,
            "    specularColor %g %g %g\n    emissiveColor %g %g %g\n    shininess %g\n    transparency %g\n  }\n"
            ,(double)*(float *)((long)local_8 + 0x7c),(double)*(float *)(local_8 + 0x10),
            (double)*(float *)((long)local_8 + 0x84),(double)*(float *)(local_8 + 0x11),
            (double)*(float *)((long)local_8 + 0x8c),(double)*(float *)(local_8 + 0x12),
            (double)(*(float *)((long)local_8 + 0x94) / 128.0),(double)local_48);
    if (local_24 != 0) {
      local_1c = local_24;
      fprintf(local_10,"  Coordinate3 {\n    point [\n");
      for (local_18 = 0; local_18 < local_24; local_18 = local_18 + 1) {
        bsp_get_point((void *)local_8[6],local_18,&local_44);
        if (local_18 < local_1c + -1) {
          fprintf(local_10,"      %g %g %g,\n",(double)local_44,(double)local_3c,(double)-local_40);
        }
        else {
          fprintf(local_10,"      %g %g %g\n",(double)local_44,(double)local_3c,(double)-local_40);
        }
      }
      fprintf(local_10,"    ]\n  }\n");
      local_1c = bsp_get_num_points((void *)CONCAT44(iVar3,uVar2));
      if (local_1c != 0) {
        fprintf(local_10,"  TextureCoordinate2 {\n    point [\n");
        for (local_18 = 0; local_18 < local_1c; local_18 = local_18 + 1) {
          bsp_get_point((void *)local_8[1],local_18,&local_44);
          if (local_18 < local_1c + -1) {
            fprintf(local_10,"      %g %g,\n",(double)local_44,(double)local_40);
          }
          else {
            fprintf(local_10,"      %g %g\n",(double)local_44,(double)local_40);
          }
        }
        fprintf(local_10,"    ]\n  }\n");
      }
      if (local_20 != 0) {
        if (iVar3 != 0) {
          fprintf(local_10,"  MaterialBinding {\n    value PER_VERTEX_INDEXED\n  }\n");
        }
        fprintf(local_10,"  IndexedFaceSet {\n");
        if (iVar3 != 0) {
          fprintf(local_10,"    materialIndex [\n      ");
          print_index_array((FILE *)CONCAT44(iVar3,uVar2),in_stack_ffffffffffffffa8);
          fprintf(local_10,"    ]\n}\n");
        }
        fprintf(local_10,"    coordIndex [\n      ");
        print_index_array((FILE *)CONCAT44(iVar3,uVar2),in_stack_ffffffffffffffa8);
        fprintf(local_10,"    ]\n");
        if (local_2c != 0) {
          fprintf(local_10,"    textureCoordIndex [\n      ");
          print_index_array((FILE *)CONCAT44(iVar3,uVar2),in_stack_ffffffffffffffa8);
          fprintf(local_10,"    ]\n");
        }
        fprintf(local_10,"  }\n");
      }
    }
    fprintf(local_10,"  }\n");
  }
  return;
}

Assistant:

static void
convertFaceset(faceset *data, FILE *file)
{
  int dotex;
  int i, n,icnt, vcnt, lcnt, tcnt;
  float r,g,b;
  float tmp[3];
  float trans;
  int color_per_vertex = 0;

  icnt = array_count(data->indices);
  vcnt = bsp_get_num_points(data->bspTree);
  lcnt = array_count(data->lineIndices);
  tcnt = array_count(data->texIndices);
  dotex = data->texture_pattern_index >= 0 &&
    data->texture_pattern_filename != NULL;

  if (vcnt == 0) return;

  fprintf(file,"  Separator {\n");

#define bsptree data->bspTree
#define texcoords data->texcoords

  if (dotex) {
    fprintf(file,
            "  Texture2 {\n"
            "    filename \"%s\"\n"
            "  }\n", data->texture_pattern_filename);
  }

  r = (data->packed_color & 0xff) / 255.0f;
  g = (data->packed_color & 0xff00) / (256.0f*255.0f);
  b = (data->packed_color & 0xff0000) / (65536*255.0f);

  if (data->lightmode == 1 || data->lightmode == 3) {
    if (bsp_get_num_points(data->vertex_colors) > 1) {
      color_per_vertex = 1;
    }
    else {
      bsp_get_point(data->vertex_colors, 0, tmp);
      r = tmp[0]; g = tmp[1]; b = tmp[2];
    }
  }

  if (color_per_vertex) {
    fprintf(file,
            "  Material {\n"
            "    ambientColor %g %g %g\n"
            "    diffuseColor [\n",
            data->material.ambient_red,
            data->material.ambient_green,
            data->material.ambient_blue);

    n = bsp_get_num_points(data->vertex_colors);
    for (i = 0; i < n; i++) {
      bsp_get_point(data->vertex_colors, i, tmp);
      if (i < n-1)
        fprintf(file,"      %g %g %g,\n", tmp[0], tmp[1], tmp[2]);
      else
        fprintf(file,"      %g %g %g\n", tmp[0], tmp[1], tmp[2]);
    }
    fprintf(file,"    ]\n");
  }
  else {
    fprintf(file,
            "  Material {\n"
            "    diffuseColor %g %g %g\n"
            "    ambientColor %g %g %g\n",
            data->material.diffuse_red * r,
            data->material.diffuse_green * g,
            data->material.diffuse_blue * b,
            data->material.ambient_red * r,
            data->material.ambient_green * g,
            data->material.ambient_blue * b);
  }

  trans = 1.0f - (data->material.alpha *
                  (1.0f - (data->transparency / 65535.0f)));

  if (trans < 1.0f/255.0f)
    trans = 0.0f;
  else if (trans > 1.0f)
    trans = 1.0f;

  fprintf(file,
          "    specularColor %g %g %g\n"
          "    emissiveColor %g %g %g\n"
          "    shininess %g\n"
          "    transparency %g\n"
          "  }\n",
          data->material.specular_red,
          data->material.specular_green,
          data->material.specular_blue,
          data->material.emissive_red,
          data->material.emissive_green,
          data->material.emissive_blue,
          data->material.shininess / 128.0f,
          trans);

  if (vcnt) {
    n = vcnt;
    fprintf(file,
            "  Coordinate3 {\n"
            "    point [\n");
    for (i = 0; i < vcnt; i++) {
      bsp_get_point(bsptree, i, tmp);
      if (i < n-1)
        fprintf(file, "      %g %g %g,\n", tmp[0], tmp[2], -tmp[1]);
      else
        fprintf(file, "      %g %g %g\n", tmp[0], tmp[2], -tmp[1]);
    }
    fprintf(file,
            "    ]\n"
            "  }\n");

    n = bsp_get_num_points(texcoords);
    if (n) {
      fprintf(file,
              "  TextureCoordinate2 {\n"
              "    point [\n");
      for (i = 0; i < n; i++) {
        bsp_get_point(texcoords, i, tmp);
        if (i < n-1)
          fprintf(file,"      %g %g,\n", tmp[0], tmp[1]);
        else
          fprintf(file,"      %g %g\n", tmp[0], tmp[1]);
      }
      fprintf(file,
              "    ]\n"
              "  }\n");
    }

    if (icnt) {
      if (color_per_vertex) {
        fprintf(file,
                "  MaterialBinding {\n"
                "    value PER_VERTEX_INDEXED\n"
                "  }\n");
      }

      fprintf(file,
              "  IndexedFaceSet {\n");

      if (color_per_vertex) {
        fprintf(file,"    materialIndex [\n      ");
        print_index_array(file, data->colorIdx);
        fprintf(file,"    ]\n}\n");
      }

      fprintf(file,
              "    coordIndex [\n      ");
      print_index_array(file, data->indices);
      fprintf(file,"    ]\n");

      if (tcnt) {
        fprintf(file,"    textureCoordIndex [\n      ");
        print_index_array(file, data->texIndices);
        fprintf(file,"    ]\n");
      }
      fprintf(file,"  }\n");
    }
  }
  fprintf(file,"  }\n"); /* end of Separator { */

#undef bsptree
#undef texcoords
}